

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdata.c
# Opt level: O1

size_t duckdb_je_hpdata_purge_begin(hpdata_t *hpdata,hpdata_purge_state_t *purge_state)

{
  fb_group_t *pfVar1;
  uint uVar2;
  fb_group_t fVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  sbyte sVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  fb_group_t dirty_pages [8];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  lVar5 = 0;
  purge_state->npurged = 0;
  purge_state->next_purge_search_begin = 0;
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  do {
    pfVar1 = hpdata->active_pages + lVar5;
    uVar4 = *(uint *)((long)pfVar1 + 4);
    fVar3 = pfVar1[1];
    uVar2 = *(uint *)((long)pfVar1 + 0xc);
    lVar9 = lVar5 * 8;
    *(uint *)(local_78 + lVar9) = (uint)*pfVar1 ^ 0xffffffff;
    *(uint *)(local_78 + lVar9 + 4) = uVar4 ^ 0xffffffff;
    *(uint *)(local_78 + lVar9 + 8) = (uint)fVar3 ^ 0xffffffff;
    *(uint *)(local_68 + lVar9 + -4) = uVar2 ^ 0xffffffff;
    lVar5 = lVar5 + 2;
  } while (lVar5 != 8);
  lVar5 = 0;
  do {
    uVar15 = (hpdata->touched_pages + lVar5)[1];
    uVar6 = *(ulong *)(local_78 + lVar5 * 8 + 8);
    *(fb_group_t *)(local_78 + lVar5 * 8) =
         hpdata->touched_pages[lVar5] & *(ulong *)(local_78 + lVar5 * 8);
    *(ulong *)(local_78 + lVar5 * 8 + 8) = uVar15 & uVar6;
    lVar5 = lVar5 + 2;
  } while (lVar5 != 8);
  purge_state->to_purge[6] = 0;
  purge_state->to_purge[7] = 0;
  purge_state->to_purge[4] = 0;
  purge_state->to_purge[5] = 0;
  purge_state->to_purge[2] = 0;
  purge_state->to_purge[3] = 0;
  purge_state->to_purge[0] = 0;
  purge_state->to_purge[1] = 0;
  uVar15 = 0;
  do {
    if (0x1ff < uVar15) break;
    uVar11 = uVar15 >> 6;
    uVar6 = (*(ulong *)(local_78 + uVar11 * 8) >> ((byte)uVar15 & 0x3f)) << ((byte)uVar15 & 0x3f);
    while (uVar6 == 0) {
      if (uVar11 == 7) {
        uVar12 = 0x200;
        goto LAB_0119ee13;
      }
      lVar5 = uVar11 * 8;
      uVar11 = uVar11 + 1;
      uVar6 = *(ulong *)(local_78 + lVar5 + 8);
    }
    uVar12 = 0;
    if (uVar6 != 0) {
      for (; (uVar6 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
      }
    }
    uVar12 = uVar11 << 6 | uVar12;
LAB_0119ee13:
    if (uVar12 != 0x200) {
      uVar13 = uVar12 >> 6;
      uVar4 = (uint)uVar12 & 0x3f;
      sVar8 = (sbyte)uVar4;
      uVar6 = (hpdata->active_pages[uVar13] >> sVar8) << sVar8;
      uVar11 = uVar13;
      while (uVar6 == 0) {
        if (uVar11 == 7) {
          uVar15 = 0x200;
          goto LAB_0119ee66;
        }
        lVar5 = uVar11 + 1;
        uVar11 = uVar11 + 1;
        uVar6 = hpdata->active_pages[lVar5];
      }
      uVar15 = 0;
      if (uVar6 != 0) {
        for (; (uVar6 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
        }
      }
      uVar15 = uVar11 << 6 | uVar15;
LAB_0119ee66:
      uVar11 = uVar15 - 1 >> 6;
      uVar6 = (2L << ((byte)(uVar15 - 1) & 0x3f)) - 1U & *(ulong *)(local_78 + uVar11 * 8);
      while (uVar6 == 0) {
        bVar16 = uVar11 == 0;
        uVar11 = uVar11 - 1;
        if (bVar16) {
          uVar6 = 0xffffffffffffffff;
          goto LAB_0119eeaa;
        }
        uVar6 = *(ulong *)(local_78 + uVar11 * 8);
      }
      uVar10 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> uVar10 == 0; uVar10 = uVar10 - 1) {
        }
      }
      uVar6 = (uVar11 << 6 | uVar10 ^ 0x3f) ^ 0x3f;
LAB_0119eeaa:
      uVar11 = (uVar6 - uVar12) + (ulong)uVar4 + 1;
      lVar9 = (uVar6 - uVar12) + 1;
      lVar5 = 0x40 - (ulong)uVar4;
      if (uVar11 < 0x41) {
        lVar5 = lVar9;
      }
      uVar6 = lVar9 - lVar5;
      purge_state->to_purge[uVar13] =
           purge_state->to_purge[uVar13] | (0xffffffffffffffffU >> (-(char)lVar5 & 0x3fU)) << sVar8;
      if (uVar6 < 0x41) {
        lVar5 = uVar13 + 1;
      }
      else {
        uVar6 = 0x40;
        if (uVar11 < 0x40) {
          uVar6 = uVar11;
        }
        uVar10 = (uVar11 - uVar6) - 0x41;
        uVar14 = uVar10 >> 6;
        switchD_00570541::default(purge_state->to_purge + uVar13 + 1,0xff,uVar14 * 8 + 8);
        uVar6 = (uVar11 - ((uVar10 & 0xffffffffffffffc0) + uVar6)) - 0x40;
        lVar5 = uVar13 + uVar14 + 2;
      }
      if (uVar6 != 0) {
        purge_state->to_purge[lVar5] =
             purge_state->to_purge[lVar5] | 0xffffffffffffffffU >> (-(char)uVar6 & 0x3fU);
      }
      uVar15 = uVar15 + 1;
    }
  } while (uVar12 != 0x200);
  sVar7 = hpdata->h_ntouched - hpdata->h_nactive;
  purge_state->ndirty_to_purge = sVar7;
  return sVar7;
}

Assistant:

size_t
hpdata_purge_begin(hpdata_t *hpdata, hpdata_purge_state_t *purge_state) {
	hpdata_assert_consistent(hpdata);
	/*
	 * See the comment below; we might purge any inactive extent, so it's
	 * unsafe for any other thread to turn any inactive extent active while
	 * we're operating on it.
	 */
	assert(!hpdata_alloc_allowed_get(hpdata));

	purge_state->npurged = 0;
	purge_state->next_purge_search_begin = 0;

	/*
	 * Initialize to_purge.
	 *
	 * It's possible to end up in situations where two dirty extents are
	 * separated by a retained extent:
	 * - 1 page allocated.
	 * - 1 page allocated.
	 * - 1 pages allocated.
	 *
	 * If the middle page is freed and purged, and then the first and third
	 * pages are freed, and then another purge pass happens, the hpdata
	 * looks like this:
	 * - 1 page dirty.
	 * - 1 page retained.
	 * - 1 page dirty.
	 *
	 * But it's safe to do a single 3-page purge.
	 *
	 * We do this by first computing the dirty pages, and then filling in
	 * any gaps by extending each range in the dirty bitmap to extend until
	 * the next active page.  This purges more pages, but the expensive part
	 * of purging is the TLB shootdowns, rather than the kernel state
	 * tracking; doing a little bit more of the latter is fine if it saves
	 * us from doing some of the former.
	 */

	/*
	 * The dirty pages are those that are touched but not active.  Note that
	 * in a normal-ish case, HUGEPAGE_PAGES is something like 512 and the
	 * fb_group_t is 64 bits, so this is 64 bytes, spread across 8
	 * fb_group_ts.
	 */
	fb_group_t dirty_pages[FB_NGROUPS(HUGEPAGE_PAGES)];
	fb_init(dirty_pages, HUGEPAGE_PAGES);
	fb_bit_not(dirty_pages, hpdata->active_pages, HUGEPAGE_PAGES);
	fb_bit_and(dirty_pages, dirty_pages, hpdata->touched_pages,
	    HUGEPAGE_PAGES);

	fb_init(purge_state->to_purge, HUGEPAGE_PAGES);
	size_t next_bit = 0;
	while (next_bit < HUGEPAGE_PAGES) {
		size_t next_dirty = fb_ffs(dirty_pages, HUGEPAGE_PAGES,
		    next_bit);
		/* Recall that fb_ffs returns nbits if no set bit is found. */
		if (next_dirty == HUGEPAGE_PAGES) {
			break;
		}
		size_t next_active = fb_ffs(hpdata->active_pages,
		    HUGEPAGE_PAGES, next_dirty);
		/*
		 * Don't purge past the end of the dirty extent, into retained
		 * pages.  This helps the kernel a tiny bit, but honestly it's
		 * mostly helpful for testing (where we tend to write test cases
		 * that think in terms of the dirty ranges).
		 */
		ssize_t last_dirty = fb_fls(dirty_pages, HUGEPAGE_PAGES,
		    next_active - 1);
		assert(last_dirty >= 0);
		assert((size_t)last_dirty >= next_dirty);
		assert((size_t)last_dirty - next_dirty + 1 <= HUGEPAGE_PAGES);

		fb_set_range(purge_state->to_purge, HUGEPAGE_PAGES, next_dirty,
		    last_dirty - next_dirty + 1);
		next_bit = next_active + 1;
	}

	/* We should purge, at least, everything dirty. */
	size_t ndirty = hpdata->h_ntouched - hpdata->h_nactive;
	purge_state->ndirty_to_purge = ndirty;
	assert(ndirty <= fb_scount(
	    purge_state->to_purge, HUGEPAGE_PAGES, 0, HUGEPAGE_PAGES));
	assert(ndirty == fb_scount(dirty_pages, HUGEPAGE_PAGES, 0,
	    HUGEPAGE_PAGES));

	hpdata_assert_consistent(hpdata);

	return ndirty;
}